

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,ostream *out)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  TPZGeoEl *pTVar6;
  TPZGeoEl *pTVar7;
  long lVar8;
  int64_t iVar9;
  void *this_00;
  size_type sVar10;
  TPZCompElSide *this_01;
  TPZManVector<TPZTransform<double>,_10> *this_02;
  ostream *in_RSI;
  long *in_RDI;
  TPZManVector<TPZTransform<double>,_10> tr;
  TPZCompEl *cel;
  int64_t iel;
  int64_t nmesh;
  const_iterator it;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  int nod;
  TPZVec<double> centerEuclid;
  TPZVec<double> centerMaster;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffee08;
  TPZVec<double> *in_stack_ffffffffffffee10;
  TPZTransform<double> *in_stack_ffffffffffffee18;
  TPZVec<double> *in_stack_ffffffffffffee20;
  ostream *in_stack_ffffffffffffee28;
  TPZOneShapeRestraint *in_stack_ffffffffffffee30;
  TPZVec<double> *in_stack_ffffffffffffee48;
  ostream *in_stack_ffffffffffffee50;
  ostream *in_stack_ffffffffffffeea8;
  TPZManVector<TPZTransform<double>,_10> *in_stack_ffffffffffffeeb0;
  TPZVec<TPZTransform<double>_> local_1128 [131];
  TPZCompEl *local_c8;
  long local_c0;
  long local_b8;
  _List_node_base *local_b0;
  iterator local_a8;
  _List_const_iterator<TPZOneShapeRestraint> local_a0;
  iterator local_98;
  _List_const_iterator<TPZOneShapeRestraint> local_90;
  undefined1 local_88 [24];
  int local_70;
  undefined8 local_60;
  undefined1 local_58 [32];
  undefined8 local_38;
  undefined1 local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar4 = std::operator<<(in_RSI,
                           "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print(std::ostream &) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  TPZCompEl::Print((TPZCompEl *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator<<(local_10,"Integration rule ");
  plVar5 = (long *)(**(code **)(*in_RDI + 0x240))();
  (**(code **)(*plVar5 + 0x60))(plVar5,local_10);
  pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
  if (pTVar6 != (TPZGeoEl *)0x0) {
    std::operator<<(local_10,"\nCenter coordinate: ");
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
    (**(code **)(*(long *)pTVar6 + 0x210))();
    local_38 = 0;
    TPZVec<double>::TPZVec
              (in_stack_ffffffffffffee20,(int64_t)in_stack_ffffffffffffee18,
               (double *)in_stack_ffffffffffffee10);
    local_60 = 0;
    TPZVec<double>::TPZVec
              (in_stack_ffffffffffffee20,(int64_t)in_stack_ffffffffffffee18,
               (double *)in_stack_ffffffffffffee10);
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
    pTVar7 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
    iVar2 = (**(code **)(*(long *)pTVar7 + 0xf0))();
    (**(code **)(*(long *)pTVar6 + 0x260))(pTVar6,iVar2 + -1,local_30);
    in_stack_ffffffffffffeeb0 =
         (TPZManVector<TPZTransform<double>,_10> *)
         TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
    (*(in_stack_ffffffffffffeeb0->super_TPZVec<TPZTransform<double>_>)._vptr_TPZVec[0x45])
              (in_stack_ffffffffffffeeb0,local_30,local_58);
    in_stack_ffffffffffffeea8 = ::operator<<(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    std::ostream::operator<<(in_stack_ffffffffffffeea8,std::endl<char,std::char_traits<char>>);
    TPZVec<double>::~TPZVec(in_stack_ffffffffffffee10);
    TPZVec<double>::~TPZVec(in_stack_ffffffffffffee10);
  }
  lVar8 = (**(code **)(*in_RDI + 0xb8))();
  if (lVar8 == 0) {
    std::operator<<(local_10,"No material\n");
  }
  else {
    poVar4 = std::operator<<(local_10,"Material id ");
    plVar5 = (long *)(**(code **)(*in_RDI + 0xb8))();
    iVar2 = (**(code **)(*plVar5 + 0x58))();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4,"\n");
  }
  poVar4 = std::operator<<(local_10,"Number of connects = ");
  iVar2 = (**(code **)(*in_RDI + 0x90))();
  std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(local_10,"Connect indexes : ");
  for (local_70 = 0; iVar2 = local_70, iVar3 = (**(code **)(*in_RDI + 0x90))(), poVar4 = local_10,
      iVar2 < iVar3; local_70 = local_70 + 1) {
    lVar8 = (**(code **)(*in_RDI + 0xa0))(in_RDI,local_70);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar8);
    std::operator<<(poVar4,' ');
  }
  pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
  if (pTVar6 != (TPZGeoEl *)0x0) {
    poVar4 = std::operator<<(local_10,"Reference Index = ");
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
    iVar9 = TPZGeoEl::Index(pTVar6);
    this_00 = (void *)std::ostream::operator<<(poVar4,iVar9);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*in_RDI + 0x1a0))(local_88);
  sVar10 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::size
                     ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                      in_stack_ffffffffffffee10);
  if (sVar10 != 0) {
    std::operator<<(local_10,"One shape restraints\n");
    local_98._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                   (in_stack_ffffffffffffee08);
    std::_List_const_iterator<TPZOneShapeRestraint>::_List_const_iterator(&local_90,&local_98);
    while( true ) {
      local_a8._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                     (in_stack_ffffffffffffee08);
      std::_List_const_iterator<TPZOneShapeRestraint>::_List_const_iterator(&local_a0,&local_a8);
      bVar1 = std::operator!=(&local_90,&local_a0);
      if (!bVar1) break;
      std::_List_const_iterator<TPZOneShapeRestraint>::operator->
                ((_List_const_iterator<TPZOneShapeRestraint> *)in_stack_ffffffffffffee10);
      TPZOneShapeRestraint::Print(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      local_b0 = (_List_node_base *)
                 std::_List_const_iterator<TPZOneShapeRestraint>::operator++(&local_90,0);
    }
  }
  std::operator<<(local_10,"\nComputational elements within multi-physics element: \n");
  local_b8 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
  for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
    poVar4 = std::operator<<(local_10,"\nComputational element belonging to the mesh ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c0);
    std::operator<<(poVar4,":\n");
    this_01 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_c0);
    local_c8 = TPZCompElSide::Element(this_01);
    if (local_c8 == (TPZCompEl *)0x0) {
      poVar4 = std::operator<<(local_10,"\n There is not element to computational mesh ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c0);
      std::operator<<(poVar4,"\n");
    }
    else {
      (**(code **)(*(long *)local_c8 + 200))(local_c8,local_10);
      pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
      if (pTVar6 != (TPZGeoEl *)0x0) {
        poVar4 = std::operator<<(local_10,"\tReference Index = ");
        pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffee18);
        iVar9 = TPZGeoEl::Index(pTVar6);
        std::ostream::operator<<(poVar4,iVar9);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  (in_stack_ffffffffffffeeb0,(int64_t)in_stack_ffffffffffffeea8);
        (**(code **)(*in_RDI + 0x280))(in_RDI,local_1128);
        this_02 = (TPZManVector<TPZTransform<double>,_10> *)
                  std::operator<<(local_10,
                                  "\n\tAffine transformation of the multiphysics element for this computational element:"
                                 );
        std::operator<<((ostream *)this_02,"\n");
        std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffee18 = (TPZTransform<double> *)std::operator<<(local_10,"\t");
        TPZVec<TPZTransform<double>_>::operator[](local_1128,local_c0);
        ::operator<<((ostream *)this_02,in_stack_ffffffffffffee18);
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector(this_02);
      }
    }
  }
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b8613a);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Print(std::ostream & out) const {
    
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZCompEl::Print(out);
    out << "Integration rule ";
    GetIntegrationRule().Print(out);
    if(this->Reference())
    {
        out << "\nCenter coordinate: ";
        TPZVec< REAL > centerMaster( this->Reference()->Dimension(),0. );
        TPZVec< REAL > centerEuclid( 3,0.);
        this->Reference()->CenterPoint(this->Reference()->NSides()-1,centerMaster);
        this->Reference()->X(centerMaster,centerEuclid);
        out << centerEuclid << std::endl;
    }
    if(this->Material())
    {
        out << "Material id " << this->Material()->Id() << "\n";
    }
    else {
        out << "No material\n";
    }
    
    out << "Number of connects = " << NConnects();
    out << "Connect indexes : ";
    int nod;
    for(nod=0; nod< NConnects(); nod++)
    {
        out << ConnectIndex(nod) <<  ' ' ;
    }
    if(this->Reference())
    {
        out << "Reference Index = " << this->Reference()->Index() << std::endl;
    }
    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }
    
    out << "\nComputational elements within multi-physics element: \n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){
        
        out << "\nComputational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "\n There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->Print(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();
        
        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
}